

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_resume_deferred_stream_item
              (nghttp2_session *session,nghttp2_stream *stream,uint8_t flags)

{
  int iVar1;
  
  iVar1 = nghttp2_stream_resume_deferred_item(stream,flags);
  if ((iVar1 == 0) && (iVar1 = 0, (stream->flags & 0x1c) == 0x10)) {
    iVar1 = session_ob_data_push(session,stream);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int session_resume_deferred_stream_item(nghttp2_session *session,
                                               nghttp2_stream *stream,
                                               uint8_t flags) {
  int rv;

  rv = nghttp2_stream_resume_deferred_item(stream, flags);
  if (rv != 0) {
    return rv;
  }

  if (!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) ||
      (stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL)) {
    return 0;
  }

  return session_ob_data_push(session, stream);
}